

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::OptionParser::validateArgs(OptionParser *this,Command *args)

{
  int iVar1;
  ulong uVar2;
  ostream *poVar3;
  ostringstream oss;
  long *local_1d8;
  long local_1d0;
  long local_1c8 [2];
  undefined1 local_1b8 [8];
  _Alloc_hider local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  ostringstream local_190 [376];
  
  uVar2 = (long)(args->m_args).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(args->m_args).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 5;
  if (((ulong)(long)this->m_minArgs <= uVar2) &&
     (((long)this->m_maxArgs < 0 || (uVar2 <= (ulong)(long)this->m_maxArgs)))) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_190);
  if (this->m_maxArgs == -1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"Expected at least ",0x12);
    iVar1 = this->m_minArgs;
    local_1d8 = local_1c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"argument","");
    local_1b0._M_p = (pointer)&local_1a0;
    local_1b8 = (undefined1  [8])(long)iVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1b0,local_1d8,local_1d0 + (long)local_1d8);
    operator<<((ostream *)local_190,(pluralise *)local_1b8);
  }
  else {
    if (this->m_minArgs != this->m_maxArgs) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_190,"Expected between ",0x11);
      poVar3 = (ostream *)std::ostream::operator<<(local_190,this->m_minArgs);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," and ",5);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->m_maxArgs);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," argument",9);
      goto LAB_0013544b;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Expected ",9);
    iVar1 = this->m_minArgs;
    local_1d8 = local_1c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"argument","");
    local_1b0._M_p = (pointer)&local_1a0;
    local_1b8 = (undefined1  [8])(long)iVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1b0,local_1d8,local_1d0 + (long)local_1d8);
    operator<<((ostream *)local_190,(pluralise *)local_1b8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_p != &local_1a0) {
    operator_delete(local_1b0._M_p,local_1a0._M_allocated_capacity + 1);
  }
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8,local_1c8[0] + 1);
  }
LAB_0013544b:
  std::__cxx11::stringbuf::str();
  Command::raiseError(args,(string *)local_1b8);
}

Assistant:

void validateArgs( const Command& args ) const {
            if(  tooFewArgs( args ) || tooManyArgs( args ) ) {
                std::ostringstream oss;
                if( m_maxArgs == -1 )
                    oss <<"Expected at least " << pluralise( static_cast<std::size_t>( m_minArgs ), "argument" );
                else if( m_minArgs == m_maxArgs )
                    oss <<"Expected " << pluralise( static_cast<std::size_t>( m_minArgs ), "argument" );
                else
                    oss <<"Expected between " << m_minArgs << " and " << m_maxArgs << " argument";
                args.raiseError( oss.str() );
            }
        }